

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-test.cc
# Opt level: O2

void __thiscall TimeTest_GrowBuffer_Test::~TimeTest_GrowBuffer_Test(TimeTest_GrowBuffer_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TimeTest, GrowBuffer) {
  std::string s = "{:";
  for (int i = 0; i < 30; ++i)
    s += "%c";
  s += "}\n";
  std::time_t t = std::time(FMT_NULL);
  fmt::format(s, *std::localtime(&t));
}